

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O0

curl_wrapper * __thiscall
daw::curl_wrapper::get_string_abi_cxx11_(curl_wrapper *this,string_view url)

{
  bool bVar1;
  pointer piVar2;
  pointer pvVar3;
  const_pointer pvVar4;
  curl_slist *pcVar5;
  undefined8 uVar6;
  runtime_error *this_00;
  char *pcVar7;
  unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_> *this_01;
  string local_68 [32];
  long local_48;
  size_type pos;
  CURLcode curl_result;
  undefined1 local_29;
  unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_> *local_28;
  curl_wrapper *this_local;
  string_view url_local;
  string *result;
  
  this_local = (curl_wrapper *)url._M_str;
  this_01 = (unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
             *)url._M_len;
  local_28 = this_01;
  url_local._M_str = (char *)this;
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
  curl_easy_setopt(pvVar3,99,1);
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
  curl_easy_setopt(pvVar3,0x2776,"deflate");
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  curl_easy_setopt(pvVar3,0x2712,pvVar4);
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  bVar1 = cw_details::curl_headers::operator_cast_to_bool(&piVar2->headers);
  if (bVar1) {
    piVar2 = std::
             unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
             ::operator->(this_01);
    pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
    curl_easy_setopt(pvVar3,0x2a,1);
    piVar2 = std::
             unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
             ::operator->(this_01);
    pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
    piVar2 = std::
             unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
             ::operator->(this_01);
    pcVar5 = cw_details::curl_headers::get(&piVar2->headers);
    curl_easy_setopt(pvVar3,0x2727,pcVar5);
  }
  local_29 = 0;
  std::__cxx11::string::string((string *)this);
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
  curl_easy_setopt(pvVar3,0x4e2b,cw_details::anon_unknown_0::write_handler);
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
  curl_easy_setopt(pvVar3,0x4e6f,cw_details::anon_unknown_0::header_handler);
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  if ((piVar2->has_body & 1U) != 0) {
    piVar2 = std::
             unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
             ::operator->(this_01);
    pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
    std::unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
    operator->(this_01);
    uVar6 = std::__cxx11::string::c_str();
    curl_easy_setopt(pvVar3,0x271f,uVar6);
  }
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
  curl_easy_setopt(pvVar3,0x2711,this);
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  pvVar3 = std::unique_ptr<void,_daw::cw_details::curl_deleter>::get(&piVar2->curl);
  pos._0_4_ = curl_easy_perform(pvVar3);
  if ((int)pos != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar7 = (char *)curl_easy_strerror((int)pos);
    std::runtime_error::runtime_error(this_00,pcVar7);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar2 = std::
           unique_ptr<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>::
           operator->(this_01);
  bVar1 = cw_details::curl_headers::operator_cast_to_bool(&piVar2->headers);
  if ((bVar1) && (local_48 = std::__cxx11::string::find((char *)this,0x107021), local_48 != -1)) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)this);
    std::__cxx11::string::operator=((string *)this,local_68);
    std::__cxx11::string::~string(local_68);
  }
  return this;
}

Assistant:

std::string curl_wrapper::get_string( std::string_view url ) {
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_NOSIGNAL, 1 );
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_ACCEPT_ENCODING, "deflate" );
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_URL, url.data( ) );
		if( m_impl->headers ) {
			curl_easy_setopt( m_impl->curl.get( ), CURLOPT_HEADER, true );
			curl_easy_setopt( m_impl->curl.get( ), CURLOPT_HTTPHEADER,
			                  m_impl->headers.get( ) );
		}
		std::string result;
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_WRITEFUNCTION,
		                  cw_details::write_handler );
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_HEADERFUNCTION,
		                  cw_details::header_handler );
		if( m_impl->has_body ) {
			curl_easy_setopt( m_impl->curl.get( ), CURLOPT_POSTFIELDS,
			                  m_impl->body.c_str( ) );
		}
		curl_easy_setopt( m_impl->curl.get( ), CURLOPT_WRITEDATA, &result );

		auto const curl_result = curl_easy_perform( m_impl->curl.get( ) );
		if( curl_result != CURLE_OK ) {
			throw std::runtime_error( curl_easy_strerror( curl_result ) );
		}
		if( m_impl->headers ) {
			// Cut out response headers
			auto pos = result.find( "\r\n\r\n" );
			if( pos != std::string::npos ) {
				result = result.substr( pos + 4 );
			}
		}
		return result;
	}